

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MarkVarDeleted
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int var_index)

{
  _Bit_type *p_Var1;
  int iVar2;
  
  p_Var1 = (this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) * 8 <=
      (ulong)(uint)var_index) {
    std::vector<bool,_std::allocator<bool>_>::reserve
              (&this->is_var_deleted_,
               (long)(this->vars_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(this->vars_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->is_var_deleted_,
               (long)(int)((ulong)((long)(this->vars_).
                                         super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->vars_).
                                        super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4),false);
    p_Var1 = (this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  }
  iVar2 = var_index + 0x3f;
  if (-1 < var_index) {
    iVar2 = var_index;
  }
  p_Var1[(long)(iVar2 >> 6) +
         (ulong)(((long)var_index & 0x800000000000003fU) < 0x8000000000000001) + 0xffffffffffffffff]
       = p_Var1[(long)(iVar2 >> 6) +
                (ulong)(((long)var_index & 0x800000000000003fU) < 0x8000000000000001) +
                0xffffffffffffffff] | 1L << ((byte)var_index & 0x3f);
  return;
}

Assistant:

void MarkVarDeleted(int var_index) {
    if (is_var_deleted_.size() <= static_cast<unsigned>(var_index)) {
      is_var_deleted_.reserve(vars_.capacity());
      is_var_deleted_.resize(num_vars());
    }
    is_var_deleted_[var_index] = true;
  }